

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_cpp.cpp
# Opt level: O1

string * __thiscall
flatbuffers::cpp::CppGenerator::GetUnionElement_abi_cxx11_
          (string *__return_storage_ptr__,CppGenerator *this,EnumVal *ev,bool native_type,
          IDLOptions *opts)

{
  BaseType BVar1;
  StructDef *pSVar2;
  pointer pcVar3;
  char *pcVar4;
  char *pcVar5;
  string name;
  string local_70;
  string local_50;
  
  BVar1 = (ev->union_type).base_type;
  if (BVar1 == BASE_TYPE_STRING) {
    pcVar5 = "::flatbuffers::String";
    if (native_type) {
      pcVar5 = "std::string";
    }
    pcVar4 = pcVar5 + 0x15;
    if (native_type) {
      pcVar4 = pcVar5 + 0xb;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar5,pcVar4);
  }
  else {
    if (BVar1 != BASE_TYPE_STRUCT) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/src/idl_gen_cpp.cpp"
                    ,0x423,
                    "std::string flatbuffers::cpp::CppGenerator::GetUnionElement(const EnumVal &, bool, const IDLOptions &)"
                   );
    }
    pSVar2 = (ev->union_type).struct_def;
    pcVar3 = (pSVar2->super_Definition).name._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + (pSVar2->super_Definition).name._M_string_length)
    ;
    if (native_type) {
      NativeName(&local_50,&local_70,(ev->union_type).struct_def,opts);
      std::__cxx11::string::operator=((string *)&local_70,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
    }
    BaseGenerator::WrapInNameSpace
              (__return_storage_ptr__,&this->super_BaseGenerator,
               (((ev->union_type).struct_def)->super_Definition).defined_namespace,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string GetUnionElement(const EnumVal &ev, bool native_type,
                              const IDLOptions &opts) {
    if (ev.union_type.base_type == BASE_TYPE_STRUCT) {
      std::string name = ev.union_type.struct_def->name;
      if (native_type) {
        name = NativeName(std::move(name), ev.union_type.struct_def, opts);
      }
      return WrapInNameSpace(ev.union_type.struct_def->defined_namespace, name);
    } else if (IsString(ev.union_type)) {
      return native_type ? "std::string" : "::flatbuffers::String";
    } else {
      FLATBUFFERS_ASSERT(false);
      return Name(ev);
    }
  }